

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O1

void __thiscall
ggml_backend_registry::register_backend
          (ggml_backend_registry *this,ggml_backend_reg_t reg,dl_handle_ptr *handle)

{
  long lVar1;
  ggml_backend_dev_t device;
  ulong uVar2;
  ulong uVar3;
  ggml_backend_reg_entry local_28;
  
  if (reg != (ggml_backend_reg_t)0x0) {
    local_28.handle._M_t.super___uniq_ptr_impl<void,_dl_handle_deleter>._M_t.
    super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.super__Head_base<0UL,_void_*,_false>.
    _M_head_impl = (__uniq_ptr_data<void,_dl_handle_deleter,_true,_true>)
                   (handle->_M_t).super___uniq_ptr_impl<void,_dl_handle_deleter>._M_t.
                   super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.
                   super__Head_base<0UL,_void_*,_false>._M_head_impl;
    (handle->_M_t).super___uniq_ptr_impl<void,_dl_handle_deleter>._M_t.
    super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.super__Head_base<0UL,_void_*,_false>.
    _M_head_impl = (void *)0x0;
    local_28.reg = reg;
    std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>::
    emplace_back<ggml_backend_reg_entry>(&this->backends,&local_28);
    if (local_28.handle._M_t.super___uniq_ptr_impl<void,_dl_handle_deleter>._M_t.
        super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.super__Head_base<0UL,_void_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<void,_dl_handle_deleter>)0x0) {
      dlclose();
    }
    lVar1 = ggml_backend_reg_dev_count(reg);
    if (lVar1 != 0) {
      uVar3 = 0;
      do {
        device = (ggml_backend_dev_t)ggml_backend_reg_dev_get(reg,uVar3);
        register_device(this,device);
        uVar3 = uVar3 + 1;
        uVar2 = ggml_backend_reg_dev_count(reg);
      } while (uVar3 < uVar2);
    }
  }
  return;
}

Assistant:

void register_backend(ggml_backend_reg_t reg, dl_handle_ptr handle = nullptr) {
        if (!reg) {
            return;
        }

#ifndef NDEBUG
        GGML_LOG_DEBUG("%s: registered backend %s (%zu devices)\n",
            __func__, ggml_backend_reg_name(reg), ggml_backend_reg_dev_count(reg));
#endif
        backends.push_back({ reg, std::move(handle) });
        for (size_t i = 0; i < ggml_backend_reg_dev_count(reg); i++) {
            register_device(ggml_backend_reg_dev_get(reg, i));
        }
    }